

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

TestResult * tcase_run_tfun_nofork(SRunner *sr,TCase *tc,TF *tfun,int i)

{
  clockid_t cVar1;
  int iVar2;
  undefined1 local_58 [8];
  timespec ts_end;
  timespec ts_start;
  TestResult *tr;
  int i_local;
  TF *tfun_local;
  TCase *tc_local;
  SRunner *sr_local;
  
  memset(&ts_end.tv_nsec,0,0x10);
  memset(local_58,0,0x10);
  sr_local = (SRunner *)tcase_run_checked_setup(sr,tc);
  if (sr_local == (SRunner *)0x0) {
    cVar1 = check_get_clockid();
    clock_gettime(cVar1,(timespec *)&ts_end.tv_nsec);
    iVar2 = _setjmp((__jmp_buf_tag *)error_jmp_buffer);
    if (iVar2 == 0) {
      tcase_fn_start(tfun->ttest->name,tfun->ttest->file,tfun->ttest->line);
      (*tfun->ttest->fn)(i);
    }
    cVar1 = check_get_clockid();
    clock_gettime(cVar1,(timespec *)local_58);
    tcase_run_checked_teardown(tc);
    sr_local = (SRunner *)
               receive_result_info_nofork
                         (tc->name,tfun->ttest->name,i,
                          ((local_58._0_4_ - (int)ts_end.tv_nsec) * 1000000 +
                          (int)(ts_end.tv_sec / 1000)) - (int)(ts_start.tv_sec / 1000));
  }
  return (TestResult *)sr_local;
}

Assistant:

static TestResult *tcase_run_tfun_nofork(SRunner * sr, TCase * tc, TF * tfun,
                                         int i)
{
    TestResult *tr;
    struct timespec ts_start = {0, 0}, ts_end = {0, 0};

    tr = tcase_run_checked_setup(sr, tc);
    if(tr == NULL)
    {
        clock_gettime(check_get_clockid(), &ts_start);
        if(0 == setjmp(error_jmp_buffer))
        {
            tcase_fn_start(tfun->ttest->name, tfun->ttest->file, tfun->ttest->line);
            tfun->ttest->fn(i);
        }
        clock_gettime(check_get_clockid(), &ts_end);
        tcase_run_checked_teardown(tc);
        return receive_result_info_nofork(tc->name, tfun->ttest->name, i,
                                          DIFF_IN_USEC(ts_start, ts_end));
    }

    return tr;
}